

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_det_m(REF_DBL *m,REF_DBL *det)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL a [9];
  REF_DBL *det_local;
  REF_DBL *m_local;
  
  a[8] = (REF_DBL)det;
  m_local._4_4_ = ref_matrix_m_full(m,(REF_DBL *)&ref_private_macro_code_rss_1);
  if (m_local._4_4_ == 0) {
    m_local._4_4_ = ref_matrix_det_gen(3,(REF_DBL *)&ref_private_macro_code_rss_1,(REF_DBL *)a[8]);
    if (m_local._4_4_ == 0) {
      m_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x47
             ,"ref_matrix_det_m",(ulong)m_local._4_4_,"gen det");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x45,
           "ref_matrix_det_m",(ulong)m_local._4_4_,"full");
  }
  return m_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_det_m(REF_DBL *m, REF_DBL *det) {
  REF_DBL a[9];
  RSS(ref_matrix_m_full(m, a), "full");

  RSS(ref_matrix_det_gen(3, a, det), "gen det");

  return REF_SUCCESS;
}